

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O2

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::pad
          (iterated_hash<crypto::sha1_transform> *this,size_t last_block_size,char pad_first)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = (ulong)(this->count_lo & 0x3f);
  pcVar2 = this->buffer + uVar1;
  *pcVar2 = pad_first;
  if (uVar1 < last_block_size) {
    last_block_size = last_block_size - (uVar1 + 1);
    this = (iterated_hash<crypto::sha1_transform> *)(pcVar2 + 1);
  }
  else {
    memset((iterated_hash<crypto::sha1_transform> *)(pcVar2 + 1),0,uVar1 ^ 0x3f);
    hash(this->state,this->buffer,0x40);
  }
  memset(this,0,last_block_size);
  return;
}

Assistant:

void iterated_hash<T>::pad(size_t last_block_size, char pad_first) {
	
	size_t num = util::mod_power_of_2(count_lo, size_t(block_size));
	
	buffer[num++] = pad_first;
	
	if(num <= last_block_size) {
		memset(buffer + num, 0, last_block_size - num);
	} else {
		memset(buffer + num, 0, block_size - num);
		hash(state, buffer, block_size);
		memset(buffer, 0, last_block_size);
	}
}